

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidgetPrivate::hideChildren(QWidgetPrivate *this,bool spontaneous)

{
  long *plVar1;
  uint uVar2;
  long lVar3;
  QArrayData *pQVar4;
  long lVar5;
  long lVar6;
  QWidget *widget;
  QWidgetData *pQVar7;
  QDebug QVar8;
  long lVar9;
  uint uVar10;
  char *pcVar11;
  long lVar12;
  long in_FS_OFFSET;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  undefined1 local_a8 [8];
  QDebug local_a0;
  anon_unknown_dwarf_291711 local_98 [8];
  QDebug local_90;
  undefined1 local_88 [8];
  QDebug local_80;
  QWidget *local_78;
  undefined1 *puStack_70;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&this->field_0x8;
  QtPrivateLogging::lcWidgetShowHide();
  if (((byte)QtPrivateLogging::lcWidgetShowHide::category.field_2.bools.enabledDebug._q_value.
             _M_base._M_i & 1) != 0) {
    local_58 = 2;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    uStack_48 = 0;
    uStack_44 = 0;
    local_40 = QtPrivateLogging::lcWidgetShowHide::category.name;
    QMessageLogger::debug();
    QVar8.stream = local_90.stream;
    QVar13.m_data = (storage_type *)0x12;
    QVar13.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar13);
    QTextStream::operator<<((QTextStream *)QVar8.stream,(QString *)&local_78);
    if (local_78 != (QWidget *)0x0) {
      LOCK();
      *(int *)local_78 = *(int *)local_78 + -1;
      UNLOCK();
      if (*(int *)local_78 == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
    if (*(QTextStream *)(local_90.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_90.stream,' ');
    }
    local_88 = (undefined1  [8])local_90.stream;
    *(int *)(local_90.stream + 0x28) = *(int *)(local_90.stream + 0x28) + 1;
    ::operator<<((Stream *)&local_80,(QWidget *)local_88);
    QVar8.stream = local_80.stream;
    QVar14.m_data = (storage_type *)0xd;
    QVar14.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar14);
    QTextStream::operator<<((QTextStream *)QVar8.stream,(QString *)&local_78);
    if (local_78 != (QWidget *)0x0) {
      LOCK();
      *(int *)local_78 = *(int *)local_78 + -1;
      UNLOCK();
      if (*(int *)local_78 == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
    if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_80.stream,' ');
    }
    pcVar11 = "false";
    if (spontaneous) {
      pcVar11 = "true";
    }
    QTextStream::operator<<((QTextStream *)local_80.stream,pcVar11);
    if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_80.stream,' ');
    }
    QDebug::~QDebug(&local_80);
    QDebug::~QDebug((QDebug *)local_88);
    QDebug::~QDebug(&local_90);
  }
  pQVar4 = *(QArrayData **)&this->field_0x18;
  lVar5 = *(long *)&this->field_0x20;
  lVar6 = *(long *)&this->field_0x28;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  lVar9 = lVar3;
  if (lVar6 != 0) {
    lVar12 = 0;
    do {
      widget = *(QWidget **)(lVar5 + lVar12 * 8);
      if ((widget != (QWidget *)0x0) && ((*(byte *)(*(long *)&widget->field_0x8 + 0x30) & 1) != 0))
      {
        QtPrivateLogging::lcWidgetShowHide();
        if (((byte)QtPrivateLogging::lcWidgetShowHide::category.field_2.bools.enabledDebug._q_value.
                   _M_base._M_i & 1) != 0) {
          local_58 = 2;
          uStack_54 = 0;
          uStack_50 = 0;
          uStack_4c = 0;
          uStack_48 = 0;
          uStack_44 = 0;
          local_40 = QtPrivateLogging::lcWidgetShowHide::category.name;
          QMessageLogger::debug();
          QVar8.stream = local_90.stream;
          QVar15.m_data = &DAT_0000000b;
          QVar15.m_size = (qsizetype)&local_78;
          QString::fromUtf8(QVar15);
          QTextStream::operator<<((QTextStream *)QVar8.stream,(QString *)&local_78);
          if (local_78 != (QWidget *)0x0) {
            LOCK();
            *(int *)local_78 = *(int *)local_78 + -1;
            UNLOCK();
            if (*(int *)local_78 == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          if (*(QTextStream *)(local_90.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_90.stream,' ');
          }
          local_a8 = (undefined1  [8])local_90.stream;
          *(int *)(local_90.stream + 0x28) = *(int *)(local_90.stream + 0x28) + 1;
          ::operator<<((Stream *)&local_80,(QWidget *)local_a8);
          QVar8.stream = local_80.stream;
          QVar16.m_data = (storage_type *)0xf;
          QVar16.m_size = (qsizetype)&local_78;
          QString::fromUtf8(QVar16);
          QTextStream::operator<<((QTextStream *)QVar8.stream,(QString *)&local_78);
          if (local_78 != (QWidget *)0x0) {
            LOCK();
            *(int *)local_78 = *(int *)local_78 + -1;
            UNLOCK();
            if (*(int *)local_78 == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          if (*(QTextStream *)(local_80.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_80.stream,' ');
          }
          local_a0.stream = local_80.stream;
          *(int *)(local_80.stream + 0x28) = *(int *)(local_80.stream + 0x28) + 1;
          local_78 = widget;
          anon_unknown.dwarf_291711::operator<<(local_98,&local_a0,(WidgetAttributes *)&local_78);
          QDebug::~QDebug((QDebug *)local_98);
          QDebug::~QDebug(&local_a0);
          QDebug::~QDebug(&local_80);
          QDebug::~QDebug((QDebug *)local_a8);
          QDebug::~QDebug(&local_90);
        }
        pQVar7 = widget->data;
        if ((((pQVar7->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) &&
           (uVar2 = pQVar7->widget_attributes, (short)uVar2 < 0)) {
          uVar10 = 0xffff7fff;
          if ((!spontaneous) || (uVar10 = 0xfffff7ff, (uVar2 >> 0xb & 1) != 0)) {
            pQVar7->widget_attributes = uVar2 & uVar10;
          }
          hideChildren(*(QWidgetPrivate **)&widget->field_0x8,spontaneous);
          local_78 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
          puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
          QHideEvent::QHideEvent((QHideEvent *)&local_78);
          if (spontaneous) {
            QCoreApplication::sendSpontaneousEvent(&widget->super_QObject,(QEvent *)&local_78);
            QApplicationPrivate::sendSyntheticEnterLeave
                      (*(QApplicationPrivate **)(QCoreApplication::self + 8),widget);
          }
          else {
            QCoreApplication::sendEvent(&widget->super_QObject,(QEvent *)&local_78);
            if ((widget->data->winid != 0) &&
               (((*(QWidgetPrivate **)&widget->field_0x8)->high_attributes[2] & 0x20) != 0)) {
              hide_sys(*(QWidgetPrivate **)&widget->field_0x8);
            }
            QApplicationPrivate::sendSyntheticEnterLeave
                      (*(QApplicationPrivate **)(QCoreApplication::self + 8),widget);
            uStack_4c = 0xaaaaaaaa;
            local_58 = 0x831d98;
            uStack_54 = 0;
            uStack_50 = 0x8003;
            uStack_48 = SUB84(widget,0);
            uStack_44 = (undefined4)((ulong)widget >> 0x20);
            local_40 = (char *)0xaaaaaaaaffffffff;
            QAccessible::updateAccessibility((QAccessibleEvent *)&local_58);
            QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_58);
          }
          QHideEvent::~QHideEvent((QHideEvent *)&local_78);
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar6 != lVar12);
  }
  do {
    plVar1 = (long *)(lVar9 + 0x20);
    lVar9 = *(long *)(*(long *)(lVar9 + 8) + 0x10);
    if (lVar9 == 0) break;
  } while ((*(uint *)(*plVar1 + 0xc) & 1) == 0);
  if ((*(byte *)(*plVar1 + 0x11) & 2) != 0) {
    uVar2 = *(uint *)(*(long *)(lVar3 + 0x20) + 8);
    if ((uVar2 & 2) != 0) {
      *(uint *)(*(long *)(lVar3 + 0x20) + 8) = uVar2 & 0xfffffffd;
    }
  }
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::hideChildren(bool spontaneous)
{
    Q_Q(QWidget);
    qCDebug(lcWidgetShowHide) << "Hiding children of" << q
                              << "spontaneously" << spontaneous;

    QList<QObject*> childList = children;
    for (int i = 0; i < childList.size(); ++i) {
        QWidget *widget = qobject_cast<QWidget*>(childList.at(i));
        if (!widget)
            continue;
        qCDebug(lcWidgetShowHide) << "Considering" << widget
              << "with attributes" << WidgetAttributes{widget};
        if (widget->isWindow() || !widget->isVisible())
            continue;

        if (spontaneous)
            widget->setAttribute(Qt::WA_Mapped, false);
        else
            widget->setAttribute(Qt::WA_WState_Visible, false);
        widget->d_func()->hideChildren(spontaneous);
        QHideEvent e;
        if (spontaneous) {
            QApplication::sendSpontaneousEvent(widget, &e);
        } else {
            QCoreApplication::sendEvent(widget, &e);
            if (widget->internalWinId()
                && widget->testAttribute(Qt::WA_DontCreateNativeAncestors)) {
                // hide_sys() on an ancestor won't have any affect on this
                // widget, so it needs an explicit hide_sys() of its own
                widget->d_func()->hide_sys();
            }
        }
        qApp->d_func()->sendSyntheticEnterLeave(widget);
#if QT_CONFIG(accessibility)
        if (!spontaneous) {
            QAccessibleEvent event(widget, QAccessible::ObjectHide);
            QAccessible::updateAccessibility(&event);
        }
#endif
    }

    // If the window of this widget is not closed, then the leave event
    // will eventually handle the widget under mouse use case.
    // Otherwise, we need to explicitly handle it here.
    if (QWidget* widgetWindow = q->window();
        widgetWindow && widgetWindow->data->is_closing) {
        q->setAttribute(Qt::WA_UnderMouse, false);
    }
}